

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter_enc.c
# Opt level: O0

void av1_enc_build_inter_predictor
               (AV1_COMMON *cm,MACROBLOCKD *xd,int mi_row,int mi_col,BUFFER_SET *ctx,
               BLOCK_SIZE bsize,int plane_from,int plane_to)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  long in_RSI;
  undefined8 *in_R8;
  int in_stack_00000008;
  BUFFER_SET default_ctx;
  int mi_y;
  int mi_x;
  int plane;
  int in_stack_0000bfac;
  BUFFER_SET *in_stack_0000bfb0;
  int in_stack_0000bfbc;
  uint8_t *in_stack_0000bfc0;
  MACROBLOCKD *in_stack_0000bfc8;
  AV1_COMMON *in_stack_0000bfd0;
  BLOCK_SIZE in_stack_0000bfe0;
  undefined4 in_stack_ffffffffffffffa4;
  undefined8 local_58;
  undefined8 in_stack_ffffffffffffffb0;
  MB_MODE_INFO *in_stack_ffffffffffffffb8;
  int in_stack_ffffffffffffffc4;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  int local_28;
  
  local_28 = in_stack_00000008;
  while ((local_28 <= (int)default_ctx.plane[0] &&
         ((local_28 == 0 || ((*(byte *)(in_RSI + 0xc) & 1) != 0))))) {
    iVar1 = in_EDX << 2;
    enc_build_inter_predictors
              ((AV1_COMMON *)CONCAT44(in_ECX << 2,iVar1),
               (MACROBLOCKD *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
               in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8,
               (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20),(int)in_stack_ffffffffffffffb0,
               (int)in_R8,in_ECX);
    iVar1 = is_interintra_pred((MB_MODE_INFO *)CONCAT44(in_stack_ffffffffffffffa4,iVar1));
    if (iVar1 != 0) {
      local_58 = *(undefined8 *)(in_RSI + 0x20);
      in_stack_ffffffffffffffb0 = *(undefined8 *)(in_RSI + 0xa50);
      in_stack_ffffffffffffffb8 = *(MB_MODE_INFO **)(in_RSI + 0x1480);
      in_stack_ffffffffffffffc4 = *(int *)(in_RSI + 0xa68);
      in_stack_ffffffffffffffc8 = *(undefined4 *)(in_RSI + 0x1498);
      if (in_R8 == (undefined8 *)0x0) {
        in_R8 = &local_58;
      }
      av1_build_interintra_predictor
                (in_stack_0000bfd0,in_stack_0000bfc8,in_stack_0000bfc0,in_stack_0000bfbc,
                 in_stack_0000bfb0,in_stack_0000bfac,in_stack_0000bfe0);
    }
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void av1_enc_build_inter_predictor(const AV1_COMMON *cm, MACROBLOCKD *xd,
                                   int mi_row, int mi_col,
                                   const BUFFER_SET *ctx, BLOCK_SIZE bsize,
                                   int plane_from, int plane_to) {
  for (int plane = plane_from; plane <= plane_to; ++plane) {
    if (plane && !xd->is_chroma_ref) break;
    const int mi_x = mi_col * MI_SIZE;
    const int mi_y = mi_row * MI_SIZE;
    enc_build_inter_predictors(cm, xd, plane, xd->mi[0], xd->plane[plane].width,
                               xd->plane[plane].height, mi_x, mi_y);

    if (is_interintra_pred(xd->mi[0])) {
      BUFFER_SET default_ctx = {
        { xd->plane[0].dst.buf, xd->plane[1].dst.buf, xd->plane[2].dst.buf },
        { xd->plane[0].dst.stride, xd->plane[1].dst.stride,
          xd->plane[2].dst.stride }
      };
      if (!ctx) {
        ctx = &default_ctx;
      }
      av1_build_interintra_predictor(cm, xd, xd->plane[plane].dst.buf,
                                     xd->plane[plane].dst.stride, ctx, plane,
                                     bsize);
    }
  }
}